

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::Texture2D::loadCompressed
          (Texture2D *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  code *pcVar1;
  int iVar2;
  CompressedTexFormat format;
  deUint32 dVar3;
  deBool dVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *pTVar8;
  PixelBufferAccess *pPVar9;
  void *pvVar10;
  undefined1 local_78 [8];
  PixelBufferAccess refLevelAccess;
  CompressedTexture *level;
  int levelNdx;
  deUint32 compressedFormat;
  Functions *gl;
  TexDecompressionParams *decompressionParams_local;
  CompressedTexture *levels_local;
  int numLevels_local;
  Texture2D *this_local;
  long lVar7;
  
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  format = tcu::CompressedTexture::getFormat(levels);
  dVar3 = getGLFormat(format);
  do {
    dVar4 = ::deGetFalse();
    if ((dVar4 != 0) || (this->m_glTexture == 0)) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,"m_glTexture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0xc0);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  (**(code **)(lVar7 + 0xb8))(0xde1,this->m_glTexture);
  level._0_4_ = 0;
  do {
    if (numLevels <= (int)level) {
      dVar3 = (**(code **)(lVar7 + 0x800))();
      checkError(dVar3,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0xd3);
      return;
    }
    refLevelAccess.super_ConstPixelBufferAccess.m_data = levels + (int)level;
    tcu::Texture2D::allocLevel(&this->m_refTexture,(int)level);
    pPVar9 = tcu::TextureLevelPyramid::getLevel
                       (&(this->m_refTexture).super_TextureLevelPyramid,(int)level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_78,pPVar9);
    do {
      dVar4 = ::deGetFalse();
      if (dVar4 != 0) {
LAB_00d36b98:
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,(char *)0x0,
                   "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0xcb);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      iVar2 = tcu::CompressedTexture::getWidth
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar5 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_78);
      if (iVar2 != iVar5) goto LAB_00d36b98;
      iVar2 = tcu::CompressedTexture::getHeight
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar5 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_78);
      if (iVar2 != iVar5) goto LAB_00d36b98;
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    tcu::CompressedTexture::decompress
              ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data,
               (PixelBufferAccess *)local_78,decompressionParams);
    pcVar1 = *(code **)(lVar7 + 0x288);
    iVar2 = tcu::CompressedTexture::getWidth
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    iVar5 = tcu::CompressedTexture::getHeight
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    iVar6 = tcu::CompressedTexture::getDataSize
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    pvVar10 = tcu::CompressedTexture::getData
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    (*pcVar1)(0xde1,(int)level,dVar3,iVar2,iVar5,0,iVar6,pvVar10);
    level._0_4_ = (int)level + 1;
  } while( true );
}

Assistant:

void Texture2D::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_2D, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const tcu::CompressedTexture& level = levels[levelNdx];

		// Decompress to reference texture.
		m_refTexture.allocLevel(levelNdx);
		tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevel(levelNdx);
		TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
				  level.getHeight()	== refLevelAccess.getHeight());
		level.decompress(refLevelAccess, decompressionParams);

		// Upload to GL texture in compressed form.
		gl.compressedTexImage2D(GL_TEXTURE_2D, levelNdx, compressedFormat,
								level.getWidth(), level.getHeight(), 0 /* border */, level.getDataSize(), level.getData());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}